

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
                        char *format,float power)

{
  float fVar1;
  ImDrawList *this;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImGuiID id_00;
  ImU32 IVar7;
  int iVar8;
  ImGuiWindow *this_00;
  ImGuiDataTypeInfo *pIVar9;
  ImGuiCol idx;
  float _x;
  ImGuiCol local_180;
  byte local_179;
  float local_16c;
  ImVec2 local_140;
  ImVec2 local_138;
  char *local_130;
  char *value_buf_end;
  char value_buf [64];
  undefined1 local_e0 [7];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool clicked;
  bool focus_requested;
  bool temp_input_start;
  bool temp_input_is_active;
  bool hovered;
  ImVec2 local_a8;
  undefined1 local_a0 [8];
  ImRect total_bb;
  ImVec2 local_88;
  undefined1 local_80 [8];
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *pcStack_40;
  float power_local;
  char *format_local;
  void *v_max_local;
  void *v_min_local;
  void *v_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  this_00 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this_00->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this_00,label,(char *)0x0);
    _x = CalcItemWidth();
    frame_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,_x,fVar1 + fVar1 + frame_bb.Max.y);
    local_88 = operator+(&(this_00->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_80,&(this_00->DC).CursorPos,&local_88);
    if (frame_bb.Max.x <= 0.0) {
      local_16c = 0.0;
    }
    else {
      local_16c = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,local_16c,0.0);
    local_a8 = operator+(&frame_bb.Min,(ImVec2 *)&stack0xffffffffffffff50);
    ImRect::ImRect((ImRect *)local_a0,(ImVec2 *)local_80,&local_a8);
    ItemSize((ImRect *)local_a0,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_a0,id_00,(ImRect *)local_80);
    if (bVar3) {
      if (format == (char *)0x0) {
        pIVar9 = DataTypeGetInfo(data_type);
        pcStack_40 = pIVar9->PrintFmt;
      }
      else {
        pcStack_40 = format;
        if ((data_type == 4) && (iVar8 = strcmp(format,"%d"), iVar8 != 0)) {
          pcStack_40 = PatchFormatStringFloatToInt(format);
        }
      }
      bVar4 = ItemHoverable((ImRect *)local_80,id_00);
      bVar5 = TempInputTextIsActive(id_00);
      bVar3 = false;
      if (!bVar5) {
        bVar6 = FocusableItemRegister(this_00,id_00);
        local_179 = 0;
        if (bVar4) {
          local_179 = (pIVar2->IO).MouseClicked[0];
        }
        if ((((bVar6) || ((local_179 & 1) != 0)) || (pIVar2->NavActivateId == id_00)) ||
           (pIVar2->NavInputId == id_00)) {
          SetActiveID(id_00,this_00);
          SetFocusID(id_00,this_00);
          FocusWindow(this_00);
          pIVar2->ActiveIdAllowNavDirFlags = 0xc;
          if (((bVar6) || (((local_179 & 1) != 0 && (((pIVar2->IO).KeyCtrl & 1U) != 0)))) ||
             (pIVar2->NavInputId == id_00)) {
            bVar3 = true;
            FocusableItemUnregister(this_00);
          }
        }
      }
      if ((bVar5) || (bVar3)) {
        label_local._7_1_ =
             TempInputTextScalar((ImRect *)local_80,id_00,label,data_type,v,pcStack_40);
      }
      else {
        if (pIVar2->ActiveId == id_00) {
          local_180 = 9;
        }
        else {
          local_180 = 7;
          if (pIVar2->HoveredId == id_00) {
            local_180 = 8;
          }
        }
        IVar7 = GetColorU32(local_180,1.0);
        RenderNavHighlight((ImRect *)local_80,id_00,1);
        p_min.y = (float)local_80._4_4_;
        p_min.x = (float)local_80._0_4_;
        p_max.y = frame_bb.Min.y;
        p_max.x = frame_bb.Min.x;
        RenderFrame(p_min,p_max,IVar7,true,(pIVar2->Style).FrameRounding);
        ImRect::ImRect((ImRect *)local_e0);
        value_buf[0x3f] =
             SliderBehavior((ImRect *)local_80,id_00,data_type,v,v_min,v_max,pcStack_40,power,0,
                            (ImRect *)local_e0);
        if ((bool)value_buf[0x3f]) {
          MarkItemEdited(id_00);
        }
        if ((float)local_e0._0_4_ < grab_bb.Min.x) {
          this = this_00->DrawList;
          idx = 0x13;
          if (pIVar2->ActiveId == id_00) {
            idx = 0x14;
          }
          IVar7 = GetColorU32(idx,1.0);
          ImDrawList::AddRectFilled
                    (this,(ImVec2 *)local_e0,&grab_bb.Min,IVar7,(pIVar2->Style).GrabRounding,0xf);
        }
        iVar8 = DataTypeFormatString((char *)&value_buf_end,0x40,data_type,v,pcStack_40);
        local_130 = value_buf + (long)iVar8 + -8;
        ImVec2::ImVec2(&local_138,0.5,0.5);
        RenderTextClipped((ImVec2 *)local_80,&frame_bb.Min,(char *)&value_buf_end,
                          value_buf + (long)iVar8 + -8,(ImVec2 *)0x0,&local_138,(ImRect *)0x0);
        if (0.0 < frame_bb.Max.x) {
          ImVec2::ImVec2(&local_140,frame_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                         (float)local_80._4_4_ + (pIVar2->Style).FramePadding.y);
          RenderText(local_140,label,(char *)0x0,true);
        }
        label_local._7_1_ = (bool)(value_buf[0x3f] & 1);
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::SliderScalar(const char* label, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Slider turns it into an input box
    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = TempInputTextIsActive(id);
    bool temp_input_start = false;
    if (!temp_input_is_active)
    {
        const bool focus_requested = FocusableItemRegister(window, id);
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        if (focus_requested || clicked || g.NavActivateId == id || g.NavInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
            if (focus_requested || (clicked && g.IO.KeyCtrl) || g.NavInputId == id)
            {
                temp_input_start = true;
                FocusableItemUnregister(window);
            }
        }
    }
    if (temp_input_is_active || temp_input_start)
        return TempInputTextScalar(frame_bb, id, label, data_type, v, format);

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, v, v_min, v_max, format, power, ImGuiSliderFlags_None, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.x > grab_bb.Min.x)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, v, format);
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f,0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return value_changed;
}